

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

int uv_cancel(uv_req_t *req)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  uv_mutex_t *mutex;
  int iVar7;
  long *plVar8;
  
  uVar6 = req->type - UV_FS;
  iVar7 = -0x16;
  if (uVar6 < 5) {
    lVar2 = *(long *)(&DAT_0016c968 + (ulong)uVar6 * 8);
    plVar1 = (long *)((long)req->reserved + lVar2 + -0x10);
    lVar3 = *(long *)((long)req->reserved + *(long *)(&DAT_0016c940 + (ulong)uVar6 * 8) + -0x10);
    uv_once(&once,init_once);
    mutex = &::mutex;
    uv_mutex_lock(&::mutex);
    plVar8 = (long *)((long)req->reserved + lVar2 + 8);
    uv_mutex_lock((uv_mutex_t *)(*(long *)((long)req->reserved + lVar2) + 0x88));
    plVar4 = (long *)*plVar8;
    if ((plVar4 == plVar8) || (*plVar1 == 0)) {
      uv_mutex_unlock((uv_mutex_t *)(plVar1[2] + 0x88));
      iVar7 = -0x10;
    }
    else {
      *(long **)plVar1[4] = plVar4;
      plVar4[1] = plVar1[4];
      uv_mutex_unlock((uv_mutex_t *)(plVar1[2] + 0x88));
      uv_mutex_unlock(&::mutex);
      *plVar1 = (long)uv__cancelled;
      mutex = (uv_mutex_t *)(lVar3 + 0x88);
      uv_mutex_lock(mutex);
      plVar1[3] = lVar3 + 0x78;
      puVar5 = *(undefined8 **)(lVar3 + 0x80);
      plVar1[4] = (long)puVar5;
      *puVar5 = plVar8;
      *(long **)(lVar3 + 0x80) = plVar8;
      uv_async_send((uv_async_t *)(lVar3 + 0xb0));
      iVar7 = 0;
    }
    uv_mutex_unlock(mutex);
  }
  return iVar7;
}

Assistant:

int uv_cancel(uv_req_t* req) {
  struct uv__work* wreq;
  uv_loop_t* loop;

  switch (req->type) {
  case UV_FS:
    loop =  ((uv_fs_t*) req)->loop;
    wreq = &((uv_fs_t*) req)->work_req;
    break;
  case UV_GETADDRINFO:
    loop =  ((uv_getaddrinfo_t*) req)->loop;
    wreq = &((uv_getaddrinfo_t*) req)->work_req;
    break;
  case UV_GETNAMEINFO:
    loop = ((uv_getnameinfo_t*) req)->loop;
    wreq = &((uv_getnameinfo_t*) req)->work_req;
    break;
  case UV_RANDOM:
    loop = ((uv_random_t*) req)->loop;
    wreq = &((uv_random_t*) req)->work_req;
    break;
  case UV_WORK:
    loop =  ((uv_work_t*) req)->loop;
    wreq = &((uv_work_t*) req)->work_req;
    break;
  default:
    return UV_EINVAL;
  }

  return uv__work_cancel(loop, req, wreq);
}